

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollArea::resizeEvent(AbstractScrollArea *this,QResizeEvent *e)

{
  AbstractScrollAreaPrivate *pAVar1;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QStyleOption *opt_00;
  QStyleOption local_58 [8];
  QStyleOption opt;
  QResizeEvent *e_local;
  AbstractScrollArea *this_local;
  
  QStyleOption::QStyleOption(local_58,1,0);
  QStyleOption::initFrom((QWidget *)local_58);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  opt_00 = local_58;
  AbstractScrollAreaPrivate::layoutChildren(pAVar1,opt_00);
  __fd = (int)opt_00;
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::normalizePosition(pAVar1);
  pAVar1 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  AbstractScrollAreaPrivate::calcIndicators(pAVar1);
  QWidget::update();
  QEvent::accept((QEvent *)e,__fd,__addr,in_RCX);
  QStyleOption::~QStyleOption(local_58);
  return;
}

Assistant:

void
AbstractScrollArea::resizeEvent( QResizeEvent * e )
{
	QStyleOption opt;
	opt.initFrom( this );

	d->layoutChildren( opt );
	d->normalizePosition();
	d->calcIndicators();

	update();

	e->accept();
}